

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QSettingsIniKey>::begin(QList<QSettingsIniKey> *this)

{
  QSettingsIniKey *n;
  QArrayDataPointer<QSettingsIniKey> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QSettingsIniKey> *)0x7ba7c9);
  QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
  n = QArrayDataPointer<QSettingsIniKey>::begin((QArrayDataPointer<QSettingsIniKey> *)0x7ba7da);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }